

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeParser.cpp
# Opt level: O3

void __thiscall antlr::TreeParser::traceOut(TreeParser *this,char *rname,RefAST *t)

{
  int iVar1;
  AST *pAVar2;
  bool bVar3;
  size_t sVar4;
  long lVar5;
  char *pcVar6;
  long *__s;
  long *local_48 [2];
  long local_38 [2];
  
  (*this->_vptr_TreeParser[0xc])();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"< ",2);
  if (rname == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x30e450);
  }
  else {
    sVar4 = strlen(rname);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,rname,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(",1);
  bVar3 = true;
  __s = (long *)"null";
  if ((t->ref != (ASTRef *)0x0) && (pAVar2 = t->ref->ptr, pAVar2 != (AST *)0x0)) {
    (*pAVar2->_vptr_AST[0x18])(local_48);
    if (local_48[0] == (long *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x30e450);
      bVar3 = false;
      goto LAB_0016ed32;
    }
    bVar3 = false;
    __s = local_48[0];
  }
  sVar4 = strlen((char *)__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)__s,sVar4);
LAB_0016ed32:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
  iVar1 = ((this->inputState).ref)->ptr->guessing;
  pcVar6 = "";
  if (0 < iVar1) {
    pcVar6 = " [guessing]";
  }
  lVar5 = 0xb;
  if (iVar1 < 1) {
    lVar5 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,lVar5);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  if ((!bVar3) && (local_48[0] != local_38)) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  this->traceDepth = this->traceDepth + -1;
  return;
}

Assistant:

void TreeParser::traceOut(const char* rname, RefAST t)
{
	traceIndent();

	ANTLR_USE_NAMESPACE(std)cout << "< " << rname
			<< "(" << (t ? t->toString().c_str() : "null") << ")"
			<< ((inputState->guessing>0)?" [guessing]":"")
			<< ANTLR_USE_NAMESPACE(std)endl;

	traceDepth--;
}